

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void * ImFileLoadToMemory(char *filename,char *mode,size_t *out_file_size,int padding_bytes)

{
  FILE *f;
  ImU64 count;
  void *data;
  ImU64 IVar1;
  
  if (out_file_size != (size_t *)0x0) {
    *out_file_size = 0;
  }
  f = fopen(filename,mode);
  if (f != (FILE *)0x0) {
    count = ImFileGetSize((ImFileHandle)f);
    if (count != 0xffffffffffffffff) {
      data = ImGui::MemAlloc(count + (long)padding_bytes);
      if (data != (void *)0x0) {
        IVar1 = ImFileRead(data,1,count,(ImFileHandle)f);
        if (IVar1 != count) {
          ImFileClose((ImFileHandle)f);
          ImGui::MemFree(data);
          return (void *)0x0;
        }
        if (0 < padding_bytes) {
          memset((void *)((long)data + count),0,(long)padding_bytes);
        }
        ImFileClose((ImFileHandle)f);
        if (out_file_size != (size_t *)0x0) {
          *out_file_size = count;
          return data;
        }
        return data;
      }
    }
    ImFileClose((ImFileHandle)f);
  }
  return (void *)0x0;
}

Assistant:

void*   ImFileLoadToMemory(const char* filename, const char* mode, size_t* out_file_size, int padding_bytes)
{
    IM_ASSERT(filename && mode);
    if (out_file_size)
        *out_file_size = 0;

    ImFileHandle f;
    if ((f = ImFileOpen(filename, mode)) == NULL)
        return NULL;

    size_t file_size = (size_t)ImFileGetSize(f);
    if (file_size == (size_t)-1)
    {
        ImFileClose(f);
        return NULL;
    }

    void* file_data = IM_ALLOC(file_size + padding_bytes);
    if (file_data == NULL)
    {
        ImFileClose(f);
        return NULL;
    }
    if (ImFileRead(file_data, 1, file_size, f) != file_size)
    {
        ImFileClose(f);
        IM_FREE(file_data);
        return NULL;
    }
    if (padding_bytes > 0)
        memset((void*)(((char*)file_data) + file_size), 0, (size_t)padding_bytes);

    ImFileClose(f);
    if (out_file_size)
        *out_file_size = file_size;

    return file_data;
}